

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

uint * Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,int Id,uint uSupp)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  Kit_DsdObj_t KVar4;
  uint uVar5;
  Kit_DsdObj_t *pKVar6;
  uint *pOut;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  undefined8 in_R9;
  uint *local_b8 [17];
  
  pKVar6 = Kit_DsdNtkObj(pNtk,Id);
  pOut = (uint *)Vec_PtrEntry(p->vTtNodes,Id);
  if (pKVar6 == (Kit_DsdObj_t *)0x0) {
    if ((int)(uint)pNtk->nVars <= Id) {
      __assert_fail("Id < pNtk->nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x2c1,
                    "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                   );
    }
    if (uSupp == 0) {
      return pOut;
    }
    if ((uSupp >> (Id & 0x1fU) & 1) != 0) {
      return pOut;
    }
    __assert_fail("!uSupp || uSupp != (uSupp & ~(1<<Id))",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x2c2,
                  "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                 );
  }
  KVar4 = *pKVar6;
  uVar8 = (uint)KVar4 >> 6 & 7;
  if (uVar8 == 2) {
    if (((uint)KVar4 & 0xfc000000) != 0x4000000) {
      __assert_fail("pObj->nFans == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x2d1,
                    "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                   );
    }
    uVar1 = *(ushort *)(pKVar6 + 1);
    iVar3 = Kit_DsdLitIsLeaf(pNtk,(uint)uVar1);
    if (iVar3 == 0) {
      __assert_fail("Kit_DsdLitIsLeaf( pNtk, iLit )",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x2d3,
                    "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                   );
    }
    iVar3 = Abc_Lit2Var((uint)uVar1);
    puVar7 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,iVar3,uSupp);
    iVar3 = Abc_LitIsCompl((uint)uVar1);
    uVar8 = (uint)pNtk->nVars;
    if (iVar3 != 0) goto LAB_0047d65b;
  }
  else {
    if (uVar8 == 1) {
      if ((uint)KVar4 < 0x4000000) {
        Kit_TruthFill(pOut,(uint)pNtk->nVars);
        return pOut;
      }
      __assert_fail("pObj->nFans == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                    ,0x2c9,
                    "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                   );
    }
    uVar9 = 0;
    if (uSupp == 0) {
      for (; uVar9 < (uint)KVar4 >> 0x1a; uVar9 = uVar9 + 1) {
        iVar3 = Abc_Lit2Var((uint)*(ushort *)(&pKVar6[1].field_0x0 + uVar9 * 2));
        puVar7 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,iVar3,0);
        local_b8[uVar9] = puVar7;
        KVar4 = *pKVar6;
      }
      bVar2 = false;
    }
    else {
      bVar2 = false;
      for (; uVar9 < (uint)KVar4 >> 0x1a; uVar9 = uVar9 + 1) {
        uVar1 = *(ushort *)(&pKVar6[1].field_0x0 + uVar9 * 2);
        uVar8 = Kit_DsdLitSupport(pNtk,(uint)uVar1);
        if ((uVar8 & uSupp) == 0) {
          puVar7 = (uint *)0x0;
          bVar2 = true;
        }
        else {
          iVar3 = Abc_Lit2Var((uint)uVar1);
          puVar7 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,iVar3,uSupp);
        }
        local_b8[uVar9] = puVar7;
        KVar4 = *pKVar6;
      }
    }
    uVar8 = (uint)KVar4 >> 6 & 7;
    if (uVar8 != 5) {
      if (uVar8 != 4) {
        if (uVar8 == 3) {
          Kit_TruthFill(pOut,(uint)pNtk->nVars);
          for (uVar9 = 0; uVar9 < (uint)*pKVar6 >> 0x1a; uVar9 = uVar9 + 1) {
            puVar7 = local_b8[uVar9];
            if (puVar7 != (uint *)0x0) {
              uVar1 = pNtk->nVars;
              iVar3 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar6[1].field_0x0 + uVar9 * 2));
              Kit_TruthAndPhase(pOut,pOut,puVar7,(uint)uVar1,iVar3,(int)in_R9);
            }
          }
          return pOut;
        }
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                      ,0x308,
                      "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                     );
      }
      Kit_TruthClear(pOut,(uint)pNtk->nVars);
      uVar8 = 0;
      for (uVar9 = 0; uVar9 < (uint)*pKVar6 >> 0x1a; uVar9 = uVar9 + 1) {
        if (local_b8[uVar9] != (uint *)0x0) {
          uVar1 = *(ushort *)(&pKVar6[1].field_0x0 + uVar9 * 2);
          Kit_TruthXor(pOut,pOut,local_b8[uVar9],(uint)pNtk->nVars);
          uVar5 = Abc_LitIsCompl((uint)uVar1);
          uVar8 = uVar8 ^ uVar5;
        }
      }
      if (uVar8 == 0) {
        return pOut;
      }
      uVar8 = (uint)pNtk->nVars;
      puVar7 = pOut;
LAB_0047d65b:
      Kit_TruthNot(pOut,puVar7,uVar8);
      return pOut;
    }
    if (bVar2) {
      uVar9 = 0;
      while( true ) {
        if ((uint)KVar4 >> 0x1a == uVar9) {
          __assert_fail("i < pObj->nFans",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                        ,0x310,
                        "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                       );
        }
        if (local_b8[uVar9] != (uint *)0x0) break;
        uVar9 = uVar9 + 1;
      }
      return local_b8[uVar9];
    }
    for (uVar9 = 0; uVar9 < (uint)KVar4 >> 0x1a; uVar9 = uVar9 + 1) {
      iVar3 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar6[1].field_0x0 + uVar9 * 2));
      if (iVar3 != 0) {
        Kit_TruthNot(local_b8[uVar9],local_b8[uVar9],(uint)pNtk->nVars);
      }
      KVar4 = *pKVar6;
    }
    puVar7 = (uint *)0x0;
    if (((uint)KVar4 & 0x1c0) == 0x140) {
      puVar7 = (uint *)(&pKVar6[1].field_0x0 + ((uint)KVar4 >> 8 & 0x3fc));
    }
    puVar7 = Kit_TruthCompose(p->dd,puVar7,(uint)KVar4 >> 0x1a,local_b8,(uint)pNtk->nVars,p->vTtBdds
                              ,p->vNodes);
    uVar8 = (uint)pNtk->nVars;
  }
  Kit_TruthCopy(pOut,puVar7,uVar8);
  return pOut;
}

Assistant:

unsigned * Kit_DsdTruthComputeNodeOne_rec( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, int Id, unsigned uSupp )
{
    Kit_DsdObj_t * pObj;
    unsigned * pTruthRes, * pTruthFans[16], * pTruthTemp;
    unsigned i, iLit, fCompl, nPartial = 0;
//    unsigned m, nMints, * pTruthPrime, * pTruthMint; 

    // get the node with this ID
    pObj = Kit_DsdNtkObj( pNtk, Id );
    pTruthRes = (unsigned *)Vec_PtrEntry( p->vTtNodes, Id );

    // special case: literal of an internal node
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        assert( !uSupp || uSupp != (uSupp & ~(1<<Id)) );
        return pTruthRes;
    }

    // constant node
    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        assert( pObj->nFans == 0 );
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        return pTruthRes;
    }

    // elementary variable node
    if ( pObj->Type == KIT_DSD_VAR )
    {
        assert( pObj->nFans == 1 );
        iLit = pObj->pFans[0];
        assert( Kit_DsdLitIsLeaf( pNtk, iLit ) );
        pTruthFans[0] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp );
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthRes, pTruthFans[0], pNtk->nVars );
        else
            Kit_TruthCopy( pTruthRes, pTruthFans[0], pNtk->nVars );
        return pTruthRes;
    }

    // collect the truth tables of the fanins
    if ( uSupp )
    {
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( uSupp != (uSupp & ~Kit_DsdLitSupport(pNtk, iLit)) )
                pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp );
            else
            {
                pTruthFans[i] = NULL;
                nPartial = 1;
            }
    }
    else
    {
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp );
    }
    // create the truth table

    // simple gates
    if ( pObj->Type == KIT_DSD_AND )
    {
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( pTruthFans[i] )
                Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
        return pTruthRes;
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        Kit_TruthClear( pTruthRes, pNtk->nVars );
        fCompl = 0;
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            if ( pTruthFans[i] )
            {
                Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
                fCompl ^= Abc_LitIsCompl(iLit);
            }
        }
        if ( fCompl )
            Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
        return pTruthRes;
    }
    assert( pObj->Type == KIT_DSD_PRIME );

    if ( uSupp && nPartial )
    {
        // find the only non-empty component
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( pTruthFans[i] )
                break;
        assert( i < pObj->nFans );
        return pTruthFans[i];
    }
/*
    // get the truth table of the prime node
    pTruthPrime = Kit_DsdObjTruth( pObj );
    // get storage for the temporary minterm
    pTruthMint = Vec_PtrEntry(p->vTtNodes, pNtk->nVars + pNtk->nNodes);
    // go through the minterms
    nMints = (1 << pObj->nFans);
    Kit_TruthClear( pTruthRes, pNtk->nVars );
    for ( m = 0; m < nMints; m++ )
    {
        if ( !Kit_TruthHasBit(pTruthPrime, m) )
            continue;
        Kit_TruthFill( pTruthMint, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthMint, pTruthMint, pTruthFans[i], pNtk->nVars, 0, ((m & (1<<i)) == 0) ^ Abc_LitIsCompl(iLit) );
        Kit_TruthOr( pTruthRes, pTruthRes, pTruthMint, pNtk->nVars );
    }
*/
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthFans[i], pTruthFans[i], pNtk->nVars );
    pTruthTemp = Kit_TruthCompose( p->dd, Kit_DsdObjTruth(pObj), pObj->nFans, pTruthFans, pNtk->nVars, p->vTtBdds, p->vNodes );
    Kit_TruthCopy( pTruthRes, pTruthTemp, pNtk->nVars );
    return pTruthRes;
}